

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

sat_solver *
Sbd_ManSatSolver(sat_solver *pSat,Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fQbf)

{
  ulong uVar1;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *p_00;
  int iVar13;
  int n;
  ulong uVar14;
  char *__assertion;
  int iVar15;
  int iLit;
  Vec_Int_t *local_48;
  int pLits [2];
  Gia_Man_t *local_38;
  
  iLit = 1;
  iVar2 = vWinObjs->nSize - vTfo->nSize;
  local_38 = p;
  iVar3 = Vec_IntEntry(vObj2Var,Pivot);
  iVar13 = vTfo->nSize + vWinObjs->nSize + vRoots->nSize;
  if (pSat == (sat_solver *)0x0) {
    pSat = sat_solver_new();
  }
  else {
    sat_solver_restart(pSat);
  }
  sat_solver_setnvars(pSat,vRoots->nSize + vWinObjs->nSize + vTfo->nSize + 100);
  sat_solver_addclause(pSat,&iLit,(lit *)&local_48);
  local_48 = vWinObjs;
  for (iVar15 = 1; iVar4 = vWinObjs->nSize, iVar5 = iVar2, iVar15 < iVar4; iVar15 = iVar15 + 1) {
    iVar4 = Vec_IntEntry(vWinObjs,iVar15);
    pGVar12 = Gia_ManObj(local_38,iVar4);
    uVar9 = (uint)*(undefined8 *)pGVar12;
    if ((~uVar9 & 0x9fffffff) != 0) {
      if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
        __assertion = "Gia_ObjIsAnd(pObj)";
        uVar9 = 0x4e;
        goto LAB_004628bc;
      }
      iVar5 = Vec_IntEntry(vMirrors,iVar4);
      if (-1 < iVar5) {
        __assertion = "Vec_IntEntry( vMirrors, iObj ) < 0";
        uVar9 = 0x4f;
        goto LAB_004628bc;
      }
      iVar5 = Vec_IntEntry(vObj2Var,iVar4);
      iVar6 = Vec_IntEntry(vMirrors,iVar4 - (*(uint *)pGVar12 & 0x1fffffff));
      iVar7 = Vec_IntEntry(vMirrors,iVar4 - (*(uint *)&pGVar12->field_0x4 & 0x1fffffff));
      if (iVar6 < 0) {
        iVar8 = iVar4 - (*(uint *)pGVar12 & 0x1fffffff);
      }
      else {
        iVar8 = Abc_Lit2Var(iVar6);
      }
      if (iVar7 < 0) {
        iVar4 = iVar4 - (*(uint *)&pGVar12->field_0x4 & 0x1fffffff);
      }
      else {
        iVar4 = Abc_Lit2Var(iVar7);
      }
      iVar8 = Vec_IntEntry(vObj2Var,iVar8);
      iVar4 = Vec_IntEntry(vObj2Var,iVar4);
      uVar1 = *(ulong *)pGVar12;
      uVar9 = 0;
      uVar14 = uVar1;
      if (-1 < iVar6) {
        uVar9 = Abc_LitIsCompl(iVar6);
        uVar14 = *(ulong *)pGVar12;
      }
      uVar10 = 0;
      if (-1 < iVar7) {
        uVar10 = Abc_LitIsCompl(iVar7);
      }
      uVar9 = uVar9 ^ (uint)(uVar1 >> 0x1d) & 1;
      uVar10 = (uint)(uVar14 >> 0x3d) & 1 ^ uVar10;
      iVar6 = Gia_ObjIsXor(pGVar12);
      if (iVar6 == 0) {
        sat_solver_add_and(pSat,iVar5,iVar8,iVar4,uVar9,uVar10,iVar15);
        vWinObjs = local_48;
      }
      else {
        sat_solver_add_xor(pSat,iVar5,iVar8,iVar4,uVar10 ^ uVar9);
        vWinObjs = local_48;
      }
    }
  }
  for (; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    iVar15 = Vec_IntEntry(vWinObjs,iVar5);
    pGVar12 = Gia_ManObj(local_38,iVar15);
    if (((int)(uint)*(undefined8 *)pGVar12 < 0) ||
       (((uint)*(undefined8 *)pGVar12 & 0x1fffffff) == 0x1fffffff)) {
      __assertion = "Gia_ObjIsAnd(pObj)";
      uVar9 = 0x62;
LAB_004628bc:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,uVar9,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar4 = Vec_IntEntry(vMirrors,iVar15);
    if (-1 < iVar4) {
      __assertion = "Vec_IntEntry( vMirrors, iObj ) < 0";
      uVar9 = 99;
      goto LAB_004628bc;
    }
    iVar4 = Vec_IntEntry(vObj2Var,iVar15);
    iVar4 = iVar4 + vTfo->nSize;
    iVar6 = Vec_IntEntry(vMirrors,iVar15 - (*(uint *)pGVar12 & 0x1fffffff));
    uVar9 = Vec_IntEntry(vMirrors,iVar15 - (*(uint *)&pGVar12->field_0x4 & 0x1fffffff));
    if (iVar6 < 0) {
      iVar7 = iVar15 - (*(uint *)pGVar12 & 0x1fffffff);
    }
    else {
      iVar7 = Abc_Lit2Var(iVar6);
    }
    if ((int)uVar9 < 0) {
      iVar15 = iVar15 - (*(uint *)&pGVar12->field_0x4 & 0x1fffffff);
    }
    else {
      iVar15 = Abc_Lit2Var(uVar9);
    }
    iVar7 = Vec_IntEntry(vObj2Var,iVar7);
    iVar15 = Vec_IntEntry(vObj2Var,iVar15);
    if (iVar2 <= iVar7) {
      iVar7 = iVar7 + vTfo->nSize;
    }
    if (iVar2 <= iVar15) {
      iVar15 = iVar15 + vTfo->nSize;
    }
    iVar8 = iVar7;
    if (iVar7 == iVar3) {
      iVar8 = iVar13;
    }
    iVar1 = iVar15;
    if (iVar15 == iVar3) {
      iVar1 = iVar13;
    }
    if (fQbf == 0) {
      iVar1 = iVar15;
      iVar8 = iVar7;
    }
    uVar1 = *(ulong *)pGVar12;
    uVar10 = 0;
    uVar14 = uVar1;
    if (-1 < iVar6) {
      uVar10 = Abc_LitIsCompl(iVar6);
      uVar14 = *(ulong *)pGVar12;
    }
    uVar11 = 0;
    if (-1 < (int)uVar9) {
      uVar11 = Abc_LitIsCompl(uVar9);
      uVar9 = uVar10;
    }
    uVar10 = (uint)(fQbf == 0 && iVar8 == iVar3) ^ (uint)(uVar1 >> 0x1d) & 1 ^ uVar10;
    uVar11 = (uint)(iVar1 == iVar3 && fQbf == 0) ^ (uint)(uVar14 >> 0x3d) & 1 ^ uVar11;
    iVar15 = Gia_ObjIsXor(pGVar12);
    if (iVar15 == 0) {
      sat_solver_add_and(pSat,iVar4,iVar8,iVar1,uVar10,uVar11,uVar9);
    }
    else {
      sat_solver_add_xor(pSat,iVar4,iVar8,iVar1,uVar11 ^ uVar10);
    }
    iVar4 = local_48->nSize;
    vWinObjs = local_48;
  }
  if (vRoots->nSize < 1) {
    if (fQbf != 0) {
      iVar2 = 0;
      while (iVar2 != 2) {
        pLits[0] = Abc_Var2Lit(iVar3,iVar2);
        pLits[1] = Abc_Var2Lit(iVar13,iVar2);
        iVar15 = sat_solver_addclause(pSat,pLits,(lit *)&local_38);
        iVar2 = iVar2 + 1;
        if (iVar15 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,0x97,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
      }
    }
  }
  else {
    iVar4 = iVar4 + vTfo->nSize;
    p_00 = Vec_IntAlloc(vRoots->nSize);
    for (iVar2 = 0; iVar2 < vRoots->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vRoots,iVar2);
      iVar13 = Vec_IntEntry(vMirrors,iVar3);
      if (-1 < iVar13) {
        __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                      ,0x80,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar13 = iVar4 + iVar2;
      iVar3 = Vec_IntEntry(vObj2Var,iVar3);
      iVar15 = Abc_Var2Lit(iVar13,0);
      Vec_IntPush(p_00,iVar15);
      sat_solver_add_xor(pSat,iVar3,vTfo->nSize + iVar3,iVar13,0);
    }
    iVar3 = sat_solver_addclause(pSat,p_00->pArray,p_00->pArray + p_00->nSize);
    Vec_IntFree(p_00);
    if (iVar3 == 0) goto LAB_00462822;
    iVar3 = sat_solver_nvars(pSat);
    if ((iVar3 - iVar4) + -100 != iVar2) {
      __assert_fail("sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,0x8d,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
  }
  iVar2 = sat_solver_simplify(pSat);
  if (iVar2 != 0) {
    return pSat;
  }
LAB_00462822:
  sat_solver_delete(pSat);
  return (sat_solver *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs SAT solver for the window.]

  Description [The window for the pivot node (Pivot) is represented as
  a DFS ordered array of objects (vWinObjs) whose indexed in the array
  (which will be used as SAT variables) are given in array vObj2Var.
  The TFO nodes are listed as the last ones in vWinObjs. The root nodes
  are labeled with Abc_LitIsCompl() in vTfo and also given in vRoots.
  If fQbf is 1, returns the instance meant for QBF solving. It is using
  the last variable (LastVar) as the placeholder for the second copy
  of the pivot node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, 
                               int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                               Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf )
{
    Gia_Obj_t * pObj;
    int i, iLit = 1, iObj, Fan0, Fan1, Lit0m, Lit1m, Node, fCompl0, fCompl1, RetValue;
    int TfoStart = Vec_IntSize(vWinObjs) - Vec_IntSize(vTfo);
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int LastVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    //Vec_IntPrint( vWinObjs );
    //Vec_IntPrint( vTfo );
    //Vec_IntPrint( vRoots );
    // create SAT solver
    if ( pSat == NULL )
        pSat = sat_solver_new();
    else
        sat_solver_restart( pSat );
    sat_solver_setnvars( pSat, Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots) + SBD_FVAR_MAX );
    // create constant 0 clause
    sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    // add clauses for all nodes
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, 1 )
    {
        pObj = Gia_ManObj( p, iObj );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, TfoStart )
    {
        pObj = Gia_ManObj( p, iObj );
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj ) + Vec_IntSize(vTfo);
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        Fan0 = Fan0 < TfoStart ? Fan0 : Fan0 + Vec_IntSize(vTfo);
        Fan1 = Fan1 < TfoStart ? Fan1 : Fan1 + Vec_IntSize(vTfo);
        if ( fQbf )
        {
            Fan0 = Fan0 == PivotVar ? LastVar : Fan0;
            Fan1 = Fan1 == PivotVar ? LastVar : Fan1;
        }
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (!fQbf && Fan0 == PivotVar) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (!fQbf && Fan1 == PivotVar) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    if ( Vec_IntSize(vRoots) > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo);
        Vec_Int_t * vFaninVars = Vec_IntAlloc( Vec_IntSize(vRoots) );
        Vec_IntForEachEntry( vRoots, iObj, i )
        {
            assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
            Node = Vec_IntEntry( vObj2Var, iObj );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars, 0) );
            sat_solver_add_xor( pSat, Node, Node + Vec_IntSize(vTfo), nVars++, 0 );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vFaninVars), Vec_IntLimit(vFaninVars) );
        Vec_IntFree( vFaninVars );
        if ( RetValue == 0 )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
        assert( sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX );
    }
    else if ( fQbf )
    {
        int n, pLits[2];
        for ( n = 0; n < 2; n++ )
        {
            pLits[0] = Abc_Var2Lit( PivotVar, n );
            pLits[1] = Abc_Var2Lit( LastVar, n );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( RetValue == 0 )
    {
        sat_solver_delete( pSat );
        return NULL;    
    }
    return pSat;
}